

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmFormatter::set_charmap(CVmFormatter *this,CCharmapToLocal *cmap)

{
  uint *puVar1;
  
  if (cmap != (CCharmapToLocal *)0x0) {
    puVar1 = &(cmap->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 + 1;
  }
  if (this->cmap_ != (CCharmapToLocal *)0x0) {
    CCharmap::release_ref(&this->cmap_->super_CCharmap);
  }
  this->cmap_ = cmap;
  return;
}

Assistant:

void CVmFormatter::set_charmap(CCharmapToLocal *cmap)
{
    /* add a reference to the new mapper, if we have one */
    if (cmap != 0)
        cmap->add_ref();

    /* release our reference on any old mapper */
    if (cmap_ != 0)
        cmap_->release_ref();

    /* remember the new mapper */
    cmap_ = cmap;
}